

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O1

int ssl_use_certificate(CERT *cert,X509 *x)

{
  bool bVar1;
  uint uVar2;
  UniquePtr<CRYPTO_BUFFER> buffer;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_20;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_18;
  
  if (x == (X509 *)0x0) {
    uVar2 = 0;
    ERR_put_error(0x10,0,0x43,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x238);
  }
  else {
    bssl::x509_to_buffer((bssl *)&local_20,x);
    if (local_20._M_head_impl == (crypto_buffer_st *)0x0) {
      uVar2 = 0;
    }
    else {
      local_18._M_head_impl = local_20._M_head_impl;
      local_20._M_head_impl = (crypto_buffer_st *)0x0;
      bVar1 = bssl::ssl_set_cert(cert,(UniquePtr<CRYPTO_BUFFER> *)&local_18);
      uVar2 = (uint)bVar1;
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_18);
    }
    std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_20);
  }
  return uVar2;
}

Assistant:

static int ssl_use_certificate(CERT *cert, X509 *x) {
  if (x == NULL) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_PASSED_NULL_PARAMETER);
    return 0;
  }

  UniquePtr<CRYPTO_BUFFER> buffer = x509_to_buffer(x);
  if (!buffer) {
    return 0;
  }

  return ssl_set_cert(cert, std::move(buffer));
}